

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

int alsa_locked_pcm_open
              (snd_pcm_t **pcm,char *pcm_name,snd_pcm_stream_t stream,snd_config_t *param_4)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&cubeb_alsa_mutex);
  if (param_4 == (snd_config_t *)0x0) {
    iVar1 = (*cubeb_snd_pcm_open)(pcm,pcm_name,stream,1);
  }
  else {
    iVar1 = (*cubeb_snd_pcm_open_lconf)(pcm,pcm_name,stream,1,param_4);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cubeb_alsa_mutex);
  return iVar1;
}

Assistant:

static int
alsa_locked_pcm_open(snd_pcm_t ** pcm, char const * pcm_name, snd_pcm_stream_t stream, snd_config_t * local_config)
{
  int r;

  pthread_mutex_lock(&cubeb_alsa_mutex);
  if (local_config) {
    r = WRAP(snd_pcm_open_lconf)(pcm, pcm_name, stream, SND_PCM_NONBLOCK, local_config);
  } else {
    r = WRAP(snd_pcm_open)(pcm, pcm_name, stream, SND_PCM_NONBLOCK);
  }
  pthread_mutex_unlock(&cubeb_alsa_mutex);

  return r;
}